

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Node<VcsolutionDepend*,QList<QString>>::emplaceValue<QList<QString>const&>
          (Node<VcsolutionDepend*,QList<QString>> *this,QList<QString> *args)

{
  Data *pDVar1;
  QString *pQVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_40;
  QArrayDataPointer<QString> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (args->d).d;
  pQVar2 = (args->d).ptr;
  qVar3 = (args->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_40.d = (Data *)0x0;
  local_40.ptr = (QString *)0x0;
  local_40.size = 0;
  local_28.d = *(Data **)(this + 8);
  local_28.ptr = *(QString **)(this + 0x10);
  *(Data **)(this + 8) = pDVar1;
  *(QString **)(this + 0x10) = pQVar2;
  local_28.size = *(qsizetype *)(this + 0x18);
  *(qsizetype *)(this + 0x18) = qVar3;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_28);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }